

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryen-c.cpp
# Opt level: O0

BinaryenExpressionRef
BinaryenRefCast(BinaryenModuleRef module,BinaryenExpressionRef ref,BinaryenType type)

{
  BinaryenType ref_00;
  RefCast *pRVar1;
  Type local_30;
  Builder local_28;
  TypeID local_20;
  BinaryenType type_local;
  BinaryenExpressionRef ref_local;
  BinaryenModuleRef module_local;
  
  local_20 = type;
  type_local = (BinaryenType)ref;
  ref_local = (BinaryenExpressionRef)module;
  wasm::Builder::Builder(&local_28,module);
  ref_00 = type_local;
  wasm::Type::Type(&local_30,local_20);
  pRVar1 = wasm::Builder::makeRefCast(&local_28,(Expression *)ref_00,local_30);
  return (BinaryenExpressionRef)pRVar1;
}

Assistant:

BinaryenExpressionRef BinaryenRefCast(BinaryenModuleRef module,
                                      BinaryenExpressionRef ref,
                                      BinaryenType type) {
  return static_cast<Expression*>(
    Builder(*(Module*)module).makeRefCast((Expression*)ref, Type(type)));
}